

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_arshift(lua_State *L)

{
  byte bVar1;
  lua_Unsigned lVar2;
  int iVar3;
  lua_Integer lVar4;
  lua_Unsigned u;
  
  lVar2 = luaL_checkunsigned(L,1);
  lVar4 = luaL_checkinteger(L,2);
  iVar3 = (int)lVar4;
  bVar1 = (byte)lVar4;
  if ((int)lVar2 < 0 && -1 < iVar3) {
    u = ~(0xffffffffU >> (bVar1 & 0x1f)) | lVar2 >> (bVar1 & 0x1f);
    if (0x1f < iVar3) {
      u = 0xffffffff;
    }
  }
  else if (iVar3 < 1) {
    u = 0;
    if (-0x20 < iVar3) {
      u = lVar2 << (-bVar1 & 0x1f);
    }
  }
  else {
    u = 0;
    if (iVar3 < 0x20) {
      u = lVar2 >> (bVar1 & 0x1f);
    }
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_arshift (lua_State *L) {
  b_uint r = luaL_checkunsigned(L, 1);
  int i = luaL_checkint(L, 2);
  if (i < 0 || !(r & ((b_uint)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(~(b_uint)0 >> i));  /* add signal bit */
    lua_pushunsigned(L, r);
    return 1;
  }
}